

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::node_copy_tree(xml_node_struct *dn,xml_node_struct *sn)

{
  xml_node_struct *pxVar1;
  xml_allocator *alloc;
  xml_allocator *pxVar2;
  xml_node_struct *dn_00;
  xml_node_struct *sn_00;
  xml_allocator *shared_alloc;
  xml_node_struct *node;
  
  alloc = get_allocator<pugi::xml_node_struct>(dn);
  pxVar2 = get_allocator<pugi::xml_node_struct>(sn);
  shared_alloc = (xml_allocator *)0x0;
  if (alloc == pxVar2) {
    shared_alloc = alloc;
  }
  node_copy_contents(dn,sn,shared_alloc);
  pxVar1 = sn->first_child;
  dn_00 = dn;
LAB_002125a5:
  node = dn_00;
  sn_00 = pxVar1;
  if ((sn_00 == (xml_node_struct *)0x0) || (sn_00 == sn)) {
    if ((sn_00 != (xml_node_struct *)0x0) && (node != dn->parent)) {
      __assert_fail("!sit || dit == dn->parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x118e,
                    "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                   );
    }
    return;
  }
  if (node == (xml_node_struct *)0x0) {
    __assert_fail("dit",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1168,
                  "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                 );
  }
  if ((sn_00 != dn) &&
     (dn_00 = append_new_node(node,alloc,
                              (xml_node_type)sn_00->header & (node_doctype|node_declaration)),
     dn_00 != (xml_node_struct *)0x0)) goto code_r0x002125da;
  goto LAB_002125fc;
code_r0x002125da:
  node_copy_contents(dn_00,sn_00,shared_alloc);
  pxVar1 = sn_00->first_child;
  if (sn_00->first_child == (xml_node_struct *)0x0) {
LAB_002125fc:
    do {
      pxVar1 = sn_00->next_sibling;
      dn_00 = node;
      if (sn_00->next_sibling != (xml_node_struct *)0x0) break;
      sn_00 = sn_00->parent;
      node = node->parent;
      if ((sn_00 != sn) && (node == (xml_node_struct *)0x0)) {
        __assert_fail("sit == sn || dit",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x1189,
                      "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                     );
      }
      pxVar1 = sn_00;
      dn_00 = node;
    } while (sn_00 != sn);
  }
  goto LAB_002125a5;
}

Assistant:

PUGI__FN void node_copy_tree(xml_node_struct* dn, xml_node_struct* sn)
	{
		xml_allocator& alloc = get_allocator(dn);
		xml_allocator* shared_alloc = (&alloc == &get_allocator(sn)) ? &alloc : 0;

		node_copy_contents(dn, sn, shared_alloc);

		xml_node_struct* dit = dn;
		xml_node_struct* sit = sn->first_child;

		while (sit && sit != sn)
		{
			// loop invariant: dit is inside the subtree rooted at dn
			assert(dit);

			// when a tree is copied into one of the descendants, we need to skip that subtree to avoid an infinite loop
			if (sit != dn)
			{
				xml_node_struct* copy = append_new_node(dit, alloc, PUGI__NODETYPE(sit));

				if (copy)
				{
					node_copy_contents(copy, sit, shared_alloc);

					if (sit->first_child)
					{
						dit = copy;
						sit = sit->first_child;
						continue;
					}
				}
			}

			// continue to the next node
			do
			{
				if (sit->next_sibling)
				{
					sit = sit->next_sibling;
					break;
				}

				sit = sit->parent;
				dit = dit->parent;

				// loop invariant: dit is inside the subtree rooted at dn while sit is inside sn
				assert(sit == sn || dit);
			}
			while (sit != sn);
		}

		assert(!sit || dit == dn->parent);
	}